

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

UBool ucnv_outputOverflowFromUnicode
                (UConverter *cnv,char **target,char *targetLimit,int32_t **pOffsets,UErrorCode *err)

{
  char cVar1;
  int iVar2;
  uint8_t *puVar3;
  int iVar4;
  int local_5c;
  int32_t j;
  int32_t length;
  int32_t i;
  char *t;
  char *overflow;
  int32_t *offsets;
  UErrorCode *err_local;
  int32_t **pOffsets_local;
  char *targetLimit_local;
  char **target_local;
  UConverter *cnv_local;
  
  if (pOffsets == (int32_t **)0x0) {
    overflow = (char *)0x0;
  }
  else {
    overflow = (char *)*pOffsets;
  }
  cVar1 = cnv->charErrorBufferLength;
  j = 0;
  _length = (uint8_t *)*target;
  while( true ) {
    if (cVar1 <= j) {
      cnv->charErrorBufferLength = '\0';
      *target = (char *)_length;
      if (overflow != (char *)0x0) {
        *pOffsets = (int32_t *)overflow;
      }
      return '\0';
    }
    if (_length == (uint8_t *)targetLimit) break;
    iVar2 = j + 1;
    puVar3 = _length + 1;
    *_length = cnv->charErrorBuffer[j];
    j = iVar2;
    _length = puVar3;
    if (overflow != (char *)0x0) {
      overflow[0] = -1;
      overflow[1] = -1;
      overflow[2] = -1;
      overflow[3] = -1;
      overflow = overflow + 4;
    }
  }
  local_5c = 0;
  do {
    iVar2 = j + 1;
    iVar4 = local_5c + 1;
    cnv->charErrorBuffer[local_5c] = cnv->charErrorBuffer[j];
    local_5c = iVar4;
    j = iVar2;
  } while (iVar2 < cVar1);
  cnv->charErrorBufferLength = (int8_t)iVar4;
  *target = (char *)_length;
  if (overflow != (char *)0x0) {
    *pOffsets = (int32_t *)overflow;
  }
  *err = U_BUFFER_OVERFLOW_ERROR;
  return '\x01';
}

Assistant:

static UBool
ucnv_outputOverflowFromUnicode(UConverter *cnv,
                               char **target, const char *targetLimit,
                               int32_t **pOffsets,
                               UErrorCode *err) {
    int32_t *offsets;
    char *overflow, *t;
    int32_t i, length;

    t=*target;
    if(pOffsets!=NULL) {
        offsets=*pOffsets;
    } else {
        offsets=NULL;
    }

    overflow=(char *)cnv->charErrorBuffer;
    length=cnv->charErrorBufferLength;
    i=0;
    while(i<length) {
        if(t==targetLimit) {
            /* the overflow buffer contains too much, keep the rest */
            int32_t j=0;

            do {
                overflow[j++]=overflow[i++];
            } while(i<length);

            cnv->charErrorBufferLength=(int8_t)j;
            *target=t;
            if(offsets!=NULL) {
                *pOffsets=offsets;
            }
            *err=U_BUFFER_OVERFLOW_ERROR;
            return TRUE;
        }

        /* copy the overflow contents to the target */
        *t++=overflow[i++];
        if(offsets!=NULL) {
            *offsets++=-1; /* no source index available for old output */
        }
    }

    /* the overflow buffer is completely copied to the target */
    cnv->charErrorBufferLength=0;
    *target=t;
    if(offsets!=NULL) {
        *pOffsets=offsets;
    }
    return FALSE;
}